

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::EnumDescriptorProto::MergePartialFromCodedStream
          (EnumDescriptorProto *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *value;
  char *data;
  EnumValueDescriptorProto *value_00;
  EnumOptions *value_01;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  EnumDescriptorProto *this_local;
  uint32 local_40;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_40 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_40 = input->last_tag_;
      }
      if (local_40 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_40);
      if (iVar3 == 1) break;
      if (iVar3 == 2) {
        WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
        if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f8b4b;
      }
      else if ((iVar3 == 3) &&
              (WVar4 = internal::WireFormatLite::GetTagWireType(local_40),
              WVar4 == WIRETYPE_LENGTH_DELIMITED)) goto LAB_002f8d81;
LAB_002f8dcb:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
      if (WVar4 == WIRETYPE_END_GROUP) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = internal::WireFormat::SkipField(input,local_40,unknown_fields);
      if (!bVar1) {
        return false;
      }
    }
    WVar4 = internal::WireFormatLite::GetTagWireType(local_40);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) goto LAB_002f8dcb;
    value = mutable_name_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,value);
    if (!bVar1) {
      return false;
    }
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar3,PARSE);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_002f8b4b:
      do {
        value_00 = add_value(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::EnumValueDescriptorProto>(input,value_00);
        if (!bVar1) {
          return false;
        }
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      } while (bVar1);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
LAB_002f8d81:
        value_01 = mutable_options(this);
        bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::EnumOptions>
                          (input,value_01);
        if (!bVar1) {
          return false;
        }
        bVar1 = io::CodedInputStream::ExpectAtEnd(input);
        if (bVar1) {
          return true;
        }
      }
    }
  } while( true );
}

Assistant:

bool EnumDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        break;
      }

      // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_value()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_value;
        if (input->ExpectTag(26)) goto parse_options;
        break;
      }

      // optional .google.protobuf.EnumOptions options = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}